

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O2

vector<char,_std::allocator<char>_> * __thiscall
VFS::CVFS::Serialize(vector<char,_std::allocator<char>_> *__return_storage_ptr__,CVFS *this)

{
  char *Buf;
  CVFSFile *this_00;
  size_t sVar1;
  long lVar2;
  __shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_> Childs;
  VFSFile Disk;
  shared_ptr<VFS::CVFSNode> e;
  uint64_t Entries;
  
  this_00 = (CVFSFile *)operator_new(0x90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&Childs,"stream",(allocator<char> *)&e);
  CVFSFile::CVFSFile(this_00,(string *)&Childs);
  std::__shared_ptr<VFS::CVFS::CVFSFile,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<VFS::CVFS::CVFSFile,void>
            ((__shared_ptr<VFS::CVFS::CVFSFile,(__gnu_cxx::_Lock_policy)2> *)&Disk,this_00);
  std::__cxx11::string::~string((string *)&Childs);
  CVFSFile::Clear(Disk.super___shared_ptr<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  CVFSFile::Write(Disk.super___shared_ptr<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                  (this->MAGIC)._M_dataplus._M_p,(this->MAGIC)._M_string_length);
  CVFSDir::GetChilds(&Childs,(this->m_Root).
                             super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
  lVar2 = (long)Childs.
                super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)Childs.
                super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>::
  ~vector(&Childs);
  Entries = lVar2 >> 4;
  CVFSFile::Write(Disk.super___shared_ptr<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                  (char *)&Entries,8);
  FillSpace(this,Disk.super___shared_ptr<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
            ((long)this->DISK_CHUNK_SIZE - (this->MAGIC)._M_string_length) - 8);
  CVFSDir::GetChilds(&Childs,(this->m_Root).
                             super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
  for (p_Var3 = &(Childs.
                  super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>;
      p_Var3 != &(Childs.
                  super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>; p_Var3 = p_Var3 + 1)
  {
    std::__shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&e.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>,p_Var3);
    SerializeNode(this,Disk.super___shared_ptr<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,e.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&e.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = CVFSFile::Size(Disk.super___shared_ptr<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  std::vector<char,_std::allocator<char>_>::resize(__return_storage_ptr__,sVar1);
  Buf = (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_start;
  sVar1 = CVFSFile::Size(Disk.super___shared_ptr<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  CVFSFile::Read(Disk.super___shared_ptr<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr,Buf
                 ,sVar1,0);
  std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>::
  ~vector(&Childs);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&Disk.super___shared_ptr<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> Serialize()
            {
                try
                {
                    VFSFile Disk = VFSFile(new CVFSFile("stream"));
                    Disk->Clear();
                    Disk->Write(MAGIC.data(), MAGIC.size());

                    uint64_t Entries = m_Root->GetChilds().size();
                    Disk->Write((char*)&Entries, sizeof(Entries));
                    FillSpace(Disk.get(), DISK_CHUNK_SIZE - (MAGIC.size() + sizeof(Entries)));

                    auto Childs = m_Root->GetChilds();
                    for (auto e : Childs)
                        SerializeNode(Disk.get(), e.get());

                    std::vector<char> Ret;
                    Ret.resize(Disk->Size());
                    Disk->Read(&Ret[0], Disk->Size(), 0);
                    return Ret;
                }
                catch(const std::bad_alloc &e)
                {
                    throw CVFSException("Can't create stream. Out of mem. bad_alloc: " + std::string(e.what()), VFSError::OUT_OF_MEM);
                }
            }